

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLBigInteger.cpp
# Opt level: O2

XMLCh * xercesc_4_0::XMLBigInteger::getCanonicalRepresentation
                  (XMLCh *rawData,MemoryManager *memMgr,bool param_3)

{
  int iVar1;
  XMLSize_t XVar2;
  undefined4 extraout_var;
  XMLCh *pXVar3;
  int sign;
  ArrayJanitor<char16_t> jan;
  int local_2c;
  ArrayJanitor<char16_t> local_28;
  XMLCh *toDelete;
  undefined4 extraout_var_00;
  
  XVar2 = XMLString::stringLen(rawData);
  iVar1 = (*memMgr->_vptr_MemoryManager[3])(memMgr,XVar2 * 2 + 4);
  toDelete = (XMLCh *)CONCAT44(extraout_var,iVar1);
  ArrayJanitor<char16_t>::ArrayJanitor(&local_28,toDelete,memMgr);
  local_2c = 0;
  parseBigInteger(rawData,toDelete,&local_2c,XMLPlatformUtils::fgMemoryManager);
  if (local_2c == -1) {
    XVar2 = XMLString::stringLen(toDelete);
    iVar1 = (*memMgr->_vptr_MemoryManager[3])(memMgr,XVar2 * 2 + 4);
    pXVar3 = (XMLCh *)CONCAT44(extraout_var_00,iVar1);
    *pXVar3 = L'-';
    XMLString::copyString(pXVar3 + 1,toDelete);
  }
  else {
    if (local_2c == 0) {
      toDelete[0] = L'0';
      toDelete[1] = L'\0';
    }
    ArrayJanitor<char16_t>::release(&local_28);
    pXVar3 = toDelete;
  }
  ArrayJanitor<char16_t>::~ArrayJanitor(&local_28);
  return pXVar3;
}

Assistant:

XMLCh* XMLBigInteger::getCanonicalRepresentation(const XMLCh*         const rawData
                                               ,       MemoryManager* const memMgr
                                               ,       bool           /*      isNonPositiveInteger */)
{
    try 
    {
        XMLCh* retBuf = (XMLCh*) memMgr->allocate( (XMLString::stringLen(rawData) + 2) * sizeof(XMLCh));
        ArrayJanitor<XMLCh> jan(retBuf, memMgr);
        int    sign = 0;

        XMLBigInteger::parseBigInteger(rawData, retBuf, sign);

        if (sign == 0)
        {
           retBuf[0] = chDigit_0;
           retBuf[1] = chNull;           
        }
        else if (sign == -1)
        {
            XMLCh* retBuffer = (XMLCh*) memMgr->allocate( (XMLString::stringLen(retBuf) + 2) * sizeof(XMLCh));
            retBuffer[0] = chDash;
            XMLString::copyString(&(retBuffer[1]), retBuf);
            return retBuffer;
        }

        jan.release();
        return retBuf;

    }
    catch (const NumberFormatException&)
    {
        return 0;
    }

}